

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.h
# Opt level: O0

void __thiscall PartialJointPolicyPureVector::SetDepth(PartialJointPolicyPureVector *this,size_t d)

{
  size_t in_RSI;
  JointPolicy *in_RDI;
  
  JointPolicy::SetDepth(in_RDI,in_RSI);
  JPolComponent_VectorImplementation::SetDepthForIndivPols
            ((JPolComponent_VectorImplementation *)this,d);
  return;
}

Assistant:

void SetDepth(size_t d)
        {
#if 0
            if(d==MAXHORIZON)
                throw(E("PartialJointPolicyPureVector can only be used for finite horizons."));
#endif
            JointPolicy::SetDepth(d);
            JPolComponent_VectorImplementation::SetDepthForIndivPols(d);
        }